

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O0

void qDefaultMessageHandler(QtMsgType type,QMessageLogContext *context,QString *message)

{
  long lVar1;
  QtMsgType in_EDI;
  long in_FS_OFFSET;
  QString *in_stack_000000e8;
  QMessageLogContext *in_stack_000000f0;
  QtMsgType in_stack_000000fc;
  QMessageLogContext *in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  formatLogMessage(in_stack_000000fc,in_stack_000000f0,in_stack_000000e8);
  preformattedMessageHandler(in_EDI,in_stack_ffffffffffffff98,(QString *)0x247dad);
  QString::~QString((QString *)0x247db9);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void qDefaultMessageHandler(QtMsgType type, const QMessageLogContext &context,
                                   const QString &message)
{
    // A message sink logs the message to a structured or unstructured destination,
    // optionally formatting the message if the latter, and returns true if the sink
    // handled stderr output as well, which will shortcut our default stderr output.

    if (systemMessageSink.messageIsUnformatted) {
        if (systemMessageSink.sink(type, context, message))
            return;
    }

    preformattedMessageHandler(type, context, formatLogMessage(type, context, message));
}